

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLSetImplement.h
# Opt level: O0

void __thiscall
STLSetImplement<std::set<int,_std::less<int>,_std::allocator<int>_>,_KDefectiveBase>::
removeVertexFromSet(STLSetImplement<std::set<int,_std::less<int>,_std::allocator<int>_>,_KDefectiveBase>
                    *this,void *ptr,int idx)

{
  size_type sVar1;
  set<int,_std::less<int>,_std::allocator<int>_> *__ptr__;
  void *pvStack_18;
  int idx_local;
  void *ptr_local;
  STLSetImplement<std::set<int,_std::less<int>,_std::allocator<int>_>,_KDefectiveBase> *this_local;
  
  __ptr__._4_4_ = idx;
  pvStack_18 = ptr;
  ptr_local = this;
  sVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)ptr,
                     (key_type *)((long)&__ptr__ + 4));
  if (sVar1 != 0) {
    std::set<int,_std::less<int>,_std::allocator<int>_>::erase
              ((set<int,_std::less<int>,_std::allocator<int>_> *)ptr,
               (key_type *)((long)&__ptr__ + 4));
  }
  return;
}

Assistant:

void STLSetImplement<Set, Base>::removeVertexFromSet(void *ptr, int idx) {
	Set *__ptr__ = (Set*) ptr;
	if (__ptr__ -> count(idx)) __ptr__ -> erase(idx);
}